

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

BiasParameter * __thiscall caffe::LayerParameter::mutable_bias_param(LayerParameter *this)

{
  BiasParameter *this_00;
  LayerParameter *this_local;
  
  set_has_bias_param(this);
  if (this->bias_param_ == (BiasParameter *)0x0) {
    this_00 = (BiasParameter *)operator_new(0x28);
    BiasParameter::BiasParameter(this_00);
    this->bias_param_ = this_00;
  }
  return this->bias_param_;
}

Assistant:

inline ::caffe::BiasParameter* LayerParameter::mutable_bias_param() {
  set_has_bias_param();
  if (bias_param_ == NULL) {
    bias_param_ = new ::caffe::BiasParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.LayerParameter.bias_param)
  return bias_param_;
}